

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O2

void __thiscall
Physical::Physical(Physical *this,string *name,string *unitPrefix,string *unitSymbol)

{
  string local_d0;
  string local_b0;
  Unit local_90;
  
  this->_vptr_Physical = (_func_int **)&PTR__Physical_001564c0;
  (this->physicalDescription)._M_dataplus._M_p = (pointer)&(this->physicalDescription).field_2;
  (this->physicalDescription)._M_string_length = 0;
  (this->physicalDescription).field_2._M_local_buf[0] = '\0';
  Unit::Unit(&this->physicalUnit);
  std::__cxx11::string::_M_assign((string *)&this->physicalDescription);
  std::__cxx11::string::string((string *)&local_b0,(string *)unitPrefix);
  std::__cxx11::string::string((string *)&local_d0,(string *)unitSymbol);
  Unit::Unit(&local_90,&local_b0,&local_d0);
  Unit::operator=(&this->physicalUnit,&local_90);
  Unit::~Unit(&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

Physical::Physical( string name, string unitPrefix, string unitSymbol )
{
	physicalDescription = name;
	physicalUnit = Unit(unitPrefix, unitSymbol);
}